

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O1

void __thiscall P2PSocket::createServer(P2PSocket *this,string *ip,uint16_t port)

{
  SocketResource *this_00;
  long lVar1;
  Socket SVar2;
  SocketResource SVar3;
  int iVar4;
  undefined8 *puVar5;
  int *piVar6;
  long *plVar7;
  ulong *puVar8;
  ulong *local_78;
  long local_70;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  sockaddr local_38;
  
  this_00 = &this->m_socket;
  SVar2 = SocketResource::resource(this_00);
  if (SVar2 != -1) {
    plVar7 = (long *)__cxa_allocate_exception(0x20);
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Socket server was already created\n","");
    *plVar7 = (long)(plVar7 + 2);
    if (local_78 == &local_68) {
      *(undefined4 *)(plVar7 + 2) = (undefined4)local_68;
      *(undefined4 *)((long)plVar7 + 0x14) = local_68._4_4_;
      *(undefined4 *)(plVar7 + 3) = uStack_60;
      *(undefined4 *)((long)plVar7 + 0x1c) = uStack_5c;
    }
    else {
      *plVar7 = (long)local_78;
      plVar7[2] = local_68;
    }
    plVar7[1] = local_70;
    local_70 = 0;
    local_68 = local_68 & 0xffffffffffffff00;
    local_78 = &local_68;
    __cxa_throw(plVar7,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  if (port < 1000) {
    plVar7 = (long *)__cxa_allocate_exception(0x20);
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Invalid port\n","");
    *plVar7 = (long)(plVar7 + 2);
    if (local_78 == &local_68) {
      *(undefined4 *)(plVar7 + 2) = (undefined4)local_68;
      *(undefined4 *)((long)plVar7 + 0x14) = local_68._4_4_;
      *(undefined4 *)(plVar7 + 3) = uStack_60;
      *(undefined4 *)((long)plVar7 + 0x1c) = uStack_5c;
    }
    else {
      *plVar7 = (long)local_78;
      plVar7[2] = local_68;
    }
    plVar7[1] = local_70;
    local_70 = 0;
    local_68 = local_68 & 0xffffffffffffff00;
    local_78 = &local_68;
    __cxa_throw(plVar7,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  local_38.sa_data._0_2_ = port << 8 | port >> 8;
  local_38.sa_family = 2;
  local_38.sa_data._2_4_ = 0;
  SVar3 = SocketResource::create();
  this_00->m_socket = SVar3.m_socket;
  SVar2 = SocketResource::resource(this_00);
  if (SVar2 == -1) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x20);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Failed to create socket\n","");
    piVar6 = __errno_location();
    strerror(*piVar6);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_58);
    local_78 = (ulong *)*plVar7;
    puVar8 = (ulong *)(plVar7 + 2);
    if (local_78 == puVar8) {
      local_68 = *puVar8;
      uStack_60 = (undefined4)plVar7[3];
      uStack_5c = *(undefined4 *)((long)plVar7 + 0x1c);
      local_78 = &local_68;
    }
    else {
      local_68 = *puVar8;
    }
    lVar1 = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    *puVar5 = puVar5 + 2;
    if (local_78 == &local_68) {
      *(undefined4 *)(puVar5 + 2) = (undefined4)local_68;
      *(undefined4 *)((long)puVar5 + 0x14) = local_68._4_4_;
      *(undefined4 *)(puVar5 + 3) = uStack_60;
      *(undefined4 *)((long)puVar5 + 0x1c) = uStack_5c;
    }
    else {
      *puVar5 = local_78;
      puVar5[2] = local_68;
    }
    puVar5[1] = lVar1;
    local_70 = 0;
    local_68 = local_68 & 0xffffffffffffff00;
    local_78 = &local_68;
    __cxa_throw(puVar5,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  if (ip->_M_string_length == 0) {
    local_38._0_8_ = local_38._0_8_ & 0xffffffff;
  }
  else {
    iVar4 = inet_pton(2,(ip->_M_dataplus)._M_p,local_38.sa_data + 2);
    if (iVar4 < 1) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x20);
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"Invalid IPv4 host address\n","");
      piVar6 = __errno_location();
      strerror(*piVar6);
      plVar7 = (long *)std::__cxx11::string::append((char *)local_58);
      local_78 = (ulong *)*plVar7;
      puVar8 = (ulong *)(plVar7 + 2);
      if (local_78 == puVar8) {
        local_68 = *puVar8;
        uStack_60 = (undefined4)plVar7[3];
        uStack_5c = *(undefined4 *)((long)plVar7 + 0x1c);
        local_78 = &local_68;
      }
      else {
        local_68 = *puVar8;
      }
      lVar1 = plVar7[1];
      *plVar7 = (long)puVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      *puVar5 = puVar5 + 2;
      if (local_78 == &local_68) {
        *(undefined4 *)(puVar5 + 2) = (undefined4)local_68;
        *(undefined4 *)((long)puVar5 + 0x14) = local_68._4_4_;
        *(undefined4 *)(puVar5 + 3) = uStack_60;
        *(undefined4 *)((long)puVar5 + 0x1c) = uStack_5c;
      }
      else {
        *puVar5 = local_78;
        puVar5[2] = local_68;
      }
      puVar5[1] = lVar1;
      local_70 = 0;
      local_68 = local_68 & 0xffffffffffffff00;
      local_78 = &local_68;
      __cxa_throw(puVar5,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
    }
  }
  SVar2 = SocketResource::resource(this_00);
  iVar4 = bind(SVar2,&local_38,0x10);
  if (iVar4 != -1) {
    SVar2 = SocketResource::resource(this_00);
    iVar4 = ::listen(SVar2,this->m_maxPeers);
    if (-1 < iVar4) {
      return;
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x20);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Failed to start listener","");
    piVar6 = __errno_location();
    strerror(*piVar6);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_58);
    local_78 = (ulong *)*plVar7;
    puVar8 = (ulong *)(plVar7 + 2);
    if (local_78 == puVar8) {
      local_68 = *puVar8;
      uStack_60 = (undefined4)plVar7[3];
      uStack_5c = *(undefined4 *)((long)plVar7 + 0x1c);
      local_78 = &local_68;
    }
    else {
      local_68 = *puVar8;
    }
    lVar1 = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    *puVar5 = puVar5 + 2;
    if (local_78 == &local_68) {
      *(undefined4 *)(puVar5 + 2) = (undefined4)local_68;
      *(undefined4 *)((long)puVar5 + 0x14) = local_68._4_4_;
      *(undefined4 *)(puVar5 + 3) = uStack_60;
      *(undefined4 *)((long)puVar5 + 0x1c) = uStack_5c;
    }
    else {
      *puVar5 = local_78;
      puVar5[2] = local_68;
    }
    puVar5[1] = lVar1;
    local_70 = 0;
    local_68 = local_68 & 0xffffffffffffff00;
    local_78 = &local_68;
    __cxa_throw(puVar5,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x20);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Failed to bind\n","");
  piVar6 = __errno_location();
  strerror(*piVar6);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_58);
  local_78 = (ulong *)*plVar7;
  puVar8 = (ulong *)(plVar7 + 2);
  if (local_78 == puVar8) {
    local_68 = *puVar8;
    uStack_60 = (undefined4)plVar7[3];
    uStack_5c = *(undefined4 *)((long)plVar7 + 0x1c);
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar8;
  }
  lVar1 = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  *puVar5 = puVar5 + 2;
  if (local_78 == &local_68) {
    *(undefined4 *)(puVar5 + 2) = (undefined4)local_68;
    *(undefined4 *)((long)puVar5 + 0x14) = local_68._4_4_;
    *(undefined4 *)(puVar5 + 3) = uStack_60;
    *(undefined4 *)((long)puVar5 + 0x1c) = uStack_5c;
  }
  else {
    *puVar5 = local_78;
    puVar5[2] = local_68;
  }
  puVar5[1] = lVar1;
  local_70 = 0;
  local_68 = local_68 & 0xffffffffffffff00;
  local_78 = &local_68;
  __cxa_throw(puVar5,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
}

Assistant:

void P2PSocket::createServer(const std::string &ip, uint16_t port)
{
    if (m_socket.resource() != -1) {
        throw P2PSocketException("Socket server was already created\n");
    }

    // validate port
    if (port < 0x3E8 || port > 0xFFFF) {
        throw P2PSocketException("Invalid port\n");
    }

    sockaddr_in address{};
    std::memset(&address, 0, sizeof address);
    address.sin_family = AF_INET;
    address.sin_port = htons(port);

    // save socket resource
    m_socket = SocketResource::create();
    if (m_socket.resource() == -1) {
        throw P2PSocketException(std::string{"Failed to create socket\n"} + std::strerror(errno));
    }

    // validate ip
    if (ip.empty()) {
        address.sin_addr.s_addr = INADDR_ANY;
    } else {
#ifdef _WIN32
        auto addr = ::inet_addr(ip.c_str());
        if (addr == INADDR_NONE)
            throw P2PSocketException("inet_addr failure: returned INADDR_NONE");
        if (addr == INADDR_ANY)
            throw P2PSocketException("inet_addr failure: returned INADDR_ANY");
        address.sin_addr.s_addr = addr;
#else
        if (::inet_pton(AF_INET, ip.c_str(), &address.sin_addr) <= 0)
            throw P2PSocketException(std::string{"Invalid IPv4 host address\n"} +
                                     std::strerror(errno));
#endif
    }

    if (::bind(m_socket.resource(), (struct sockaddr *)&address, sizeof(address)) == -1) {
        throw P2PSocketException(std::string{"Failed to bind\n"} + std::strerror(errno));
    }

    if (::listen(m_socket.resource(), m_maxPeers) < 0) {
        throw P2PSocketException(std::string{"Failed to start listener"} + std::strerror(errno));
    }
}